

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_exception.c
# Opt level: O2

void exception_destroy(exception ex)

{
  int iVar1;
  char *pcVar2;
  
  if (ex != (exception)0x0) {
    iVar1 = exception_decrement_reference(ex);
    if (iVar1 != 0) {
      pcVar2 = "<anonymous>";
      if (ex->label != (char *)0x0) {
        pcVar2 = ex->label;
      }
      log_write_impl_va("metacall",0xeb,"exception_destroy",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_exception.c"
                        ,LOG_LEVEL_ERROR,"Invalid reference counter in exception: %s",pcVar2);
    }
    if ((ex->ref).count == 0) {
      free(ex->message);
      free(ex->label);
      free(ex->stacktrace);
      free(ex);
      LOCK();
      exception_stats.deallocations = exception_stats.deallocations + 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void exception_destroy(exception ex)
{
	if (ex != NULL)
	{
		if (exception_decrement_reference(ex) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid reference counter in exception: %s", ex->label ? ex->label : "<anonymous>");
		}

		if (threading_atomic_ref_count_load(&ex->ref) == 0)
		{
			if (ex->message != NULL)
			{
				free(ex->message);
			}

			if (ex->label != NULL)
			{
				free(ex->label);
			}

			if (ex->stacktrace != NULL)
			{
				free(ex->stacktrace);
			}

			threading_atomic_ref_count_destroy(&ex->ref);

			free(ex);

			reflect_memory_tracker_deallocation(exception_stats);
		}
	}
}